

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

RtMidiApi rtmidi_compiled_api_by_name(char *name)

{
  RtMidiApi RVar1;
  allocator<char> local_29;
  string local_28;
  
  if (name == (char *)0x0) {
    RVar1 = RTMIDI_API_UNSPECIFIED;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,name,&local_29);
    RVar1 = RtMidi::getCompiledApiByName(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return RVar1;
}

Assistant:

enum RtMidiApi rtmidi_compiled_api_by_name(const char *name) {
    RtMidi::Api api = RtMidi::UNSPECIFIED;
    if (name) {
        api = RtMidi::getCompiledApiByName(name);
    }
    return (enum RtMidiApi)api;
}